

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImVec2 ImBezierCubicCalc(ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float w4;
  float w3;
  float w2;
  float w1;
  float u;
  float t_local;
  ImVec2 *p4_local;
  ImVec2 *p3_local;
  ImVec2 *p2_local;
  ImVec2 *p1_local;
  
  fVar1 = 1.0 - t;
  fVar2 = fVar1 * fVar1 * fVar1;
  fVar3 = fVar1 * 3.0 * fVar1 * t;
  fVar1 = fVar1 * 3.0 * t * t;
  fVar4 = t * t * t;
  ImVec2::ImVec2((ImVec2 *)&p1_local,fVar4 * p4->x + fVar1 * p3->x + fVar2 * p1->x + fVar3 * p2->x,
                 fVar4 * p4->y + fVar1 * p3->y + fVar2 * p1->y + fVar3 * p2->y);
  return (ImVec2)p1_local;
}

Assistant:

ImVec2 ImBezierCubicCalc(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, float t)
{
    float u = 1.0f - t;
    float w1 = u * u * u;
    float w2 = 3 * u * u * t;
    float w3 = 3 * u * t * t;
    float w4 = t * t * t;
    return ImVec2(w1 * p1.x + w2 * p2.x + w3 * p3.x + w4 * p4.x, w1 * p1.y + w2 * p2.y + w3 * p3.y + w4 * p4.y);
}